

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_fill_polygon(nk_command_buffer *b,float *points,int point_count,nk_color col)

{
  void *pvVar1;
  nk_command_polygon_filled *cmd;
  nk_size size;
  int i;
  int point_count_local;
  float *points_local;
  nk_command_buffer *b_local;
  nk_color col_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2329,
                  "void nk_fill_polygon(struct nk_command_buffer *, float *, int, struct nk_color)")
    ;
  }
  if (((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = col.a, b_local._7_1_ != '\0')) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_POLYGON_FILLED,(long)point_count * 4 + 0x20),
     pvVar1 != (void *)0x0)) {
    *(nk_color *)((long)pvVar1 + 0x10) = col;
    *(short *)((long)pvVar1 + 0x14) = (short)point_count;
    for (size._0_4_ = 0; (int)size < point_count; size._0_4_ = (int)size + 1) {
      *(short *)((long)pvVar1 + (long)(int)size * 4 + 0x16) = (short)(int)points[(int)size * 2];
      *(short *)((long)pvVar1 + (long)(int)size * 4 + 0x18) =
           (short)(int)points[(long)((int)size * 2) + 1];
    }
  }
  return;
}

Assistant:

NK_API void
nk_fill_polygon(struct nk_command_buffer *b, float *points, int point_count,
    struct nk_color col)
{
    int i;
    nk_size size = 0;
    struct nk_command_polygon_filled *cmd;

    NK_ASSERT(b);
    if (!b || col.a == 0) return;
    size = sizeof(*cmd) + sizeof(short) * 2 * (nk_size)point_count;
    cmd = (struct nk_command_polygon_filled*)
        nk_command_buffer_push(b, NK_COMMAND_POLYGON_FILLED, size);
    if (!cmd) return;
    cmd->color = col;
    cmd->point_count = (unsigned short)point_count;
    for (i = 0; i < point_count; ++i) {
        cmd->points[i].x = (short)points[i*2+0];
        cmd->points[i].y = (short)points[i*2+1];
    }
}